

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

int lyd_lyb_data_length(char *data)

{
  uint32_t uStack_10050;
  short sStack_1004a;
  uint8_t auStack_10048 [6];
  uint8_t zero [2];
  uint8_t buf [65535];
  uint local_3c;
  uint local_38;
  uint32_t j;
  uint32_t i;
  uint32_t len;
  uint32_t feat_count;
  uint32_t count;
  lylyb_ctx *lybctx;
  char *pcStack_18;
  LY_ERR ret;
  char *data_local;
  
  lybctx._4_4_ = 0;
  j = 0;
  pcStack_18 = data;
  memset(&sStack_1004a,0,2);
  if (pcStack_18 == (char *)0x0) {
    return -1;
  }
  _feat_count = (lylyb_ctx *)calloc(1,0x38);
  if (_feat_count == (lylyb_ctx *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_lyb_data_length");
    return 1;
  }
  lybctx._4_4_ = ly_in_new_memory(pcStack_18,&_feat_count->in);
  if (((lybctx._4_4_ != LY_SUCCESS) ||
      (lybctx._4_4_ = lyb_parse_magic_number(_feat_count), lybctx._4_4_ != LY_SUCCESS)) ||
     (lybctx._4_4_ = lyb_parse_header(_feat_count), lybctx._4_4_ != LY_SUCCESS)) goto LAB_001530ec;
  lyb_read_number(&len,4,2,_feat_count);
  for (local_38 = 0; local_38 < len; local_38 = local_38 + 1) {
    lyb_read_number(&j,4,2,_feat_count);
    lyb_read(auStack_10048,(ulong)j,_feat_count);
    lyb_read(auStack_10048,2,_feat_count);
    lyb_read_number(&i,4,2,_feat_count);
    for (local_3c = 0; local_3c < i; local_3c = local_3c + 1) {
      lyb_read_number(&j,4,2,_feat_count);
      lyb_read(auStack_10048,(ulong)j,_feat_count);
    }
  }
  if (sStack_1004a == *(short *)_feat_count->in->current) {
    lyb_read((uint8_t *)0x0,2,_feat_count);
  }
  else {
    lybctx._4_4_ = lyb_read_start_siblings(_feat_count);
    if (lybctx._4_4_ != LY_SUCCESS) goto LAB_001530ec;
    lyb_skip_siblings(_feat_count);
    lybctx._4_4_ = lyb_read_stop_siblings(_feat_count);
    if (lybctx._4_4_ != LY_SUCCESS) goto LAB_001530ec;
  }
  ly_in_skip(_feat_count->in,1);
LAB_001530ec:
  len = (int)_feat_count->in->current - (int)_feat_count->in->start;
  ly_in_free(_feat_count->in,'\0');
  lylyb_ctx_free(_feat_count);
  if (lybctx._4_4_ == LY_SUCCESS) {
    uStack_10050 = len;
  }
  else {
    uStack_10050 = 0xffffffff;
  }
  return uStack_10050;
}

Assistant:

LIBYANG_API_DEF int
lyd_lyb_data_length(const char *data)
{
    LY_ERR ret = LY_SUCCESS;
    struct lylyb_ctx *lybctx;
    uint32_t count, feat_count, len = 0, i, j;
    uint8_t buf[LYB_SIZE_MAX];
    uint8_t zero[LYB_SIZE_BYTES] = {0};

    if (!data) {
        return -1;
    }

    lybctx = calloc(1, sizeof *lybctx);
    LY_CHECK_ERR_RET(!lybctx, LOGMEM(NULL), LY_EMEM);
    ret = ly_in_new_memory(data, &lybctx->in);
    LY_CHECK_GOTO(ret, cleanup);

    /* read magic number */
    ret = lyb_parse_magic_number(lybctx);
    LY_CHECK_GOTO(ret, cleanup);

    /* read header */
    ret = lyb_parse_header(lybctx);
    LY_CHECK_GOTO(ret, cleanup);

    /* read model count */
    lyb_read_number(&count, sizeof count, 2, lybctx);

    /* read all models */
    for (i = 0; i < count; ++i) {
        /* module name length */
        lyb_read_number(&len, sizeof len, 2, lybctx);

        /* model name */
        lyb_read(buf, len, lybctx);

        /* revision */
        lyb_read(buf, 2, lybctx);

        /* enabled feature count */
        lyb_read_number(&feat_count, sizeof feat_count, 2, lybctx);

        /* enabled features */
        for (j = 0; j < feat_count; ++j) {
            /* feature name length */
            lyb_read_number(&len, sizeof len, 2, lybctx);

            /* feature name */
            lyb_read(buf, len, lybctx);
        }
    }

    if (memcmp(zero, lybctx->in->current, LYB_SIZE_BYTES)) {
        /* register a new sibling */
        ret = lyb_read_start_siblings(lybctx);
        LY_CHECK_GOTO(ret, cleanup);

        /* skip it */
        lyb_skip_siblings(lybctx);

        /* sibling finished */
        ret = lyb_read_stop_siblings(lybctx);
        LY_CHECK_GOTO(ret, cleanup);
    } else {
        lyb_read(NULL, LYB_SIZE_BYTES, lybctx);
    }

    /* read the last zero, parsing finished */
    ly_in_skip(lybctx->in, 1);

cleanup:
    count = lybctx->in->current - lybctx->in->start;

    ly_in_free(lybctx->in, 0);
    lylyb_ctx_free(lybctx);

    return ret ? -1 : (int)count;
}